

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_q.h
# Opt level: O1

void __thiscall
spdlog::details::circular_q<spdlog::details::log_msg_buffer>::push_back
          (circular_q<spdlog::details::log_msg_buffer> *this,log_msg_buffer *item)

{
  size_type sVar1;
  pointer plVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  log_msg_buffer *plVar6;
  pointer plVar7;
  
  if (this->max_items_ != 0) {
    sVar1 = this->tail_;
    plVar2 = (this->v_).
             super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
             ._M_impl.super__Vector_impl_data._M_start;
    plVar6 = item;
    plVar7 = plVar2 + sVar1;
    for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
      (plVar7->super_log_msg).logger_name.data_ = (plVar6->super_log_msg).logger_name.data_;
      plVar6 = (log_msg_buffer *)&(plVar6->super_log_msg).logger_name.size_;
      plVar7 = (pointer)&(plVar7->super_log_msg).logger_name.size_;
    }
    plVar2 = plVar2 + sVar1;
    ::fmt::v6::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::operator=
              (&plVar2->buffer,&item->buffer);
    pcVar3 = (plVar2->buffer).super_buffer<char>.ptr_;
    (plVar2->super_log_msg).logger_name.data_ = pcVar3;
    (plVar2->super_log_msg).payload.data_ = pcVar3 + (plVar2->super_log_msg).logger_name.size_;
    uVar5 = (this->tail_ + 1) % this->max_items_;
    this->tail_ = uVar5;
    if (uVar5 == this->head_) {
      this->head_ = (this->head_ + 1) % this->max_items_;
      this->overrun_counter_ = this->overrun_counter_ + 1;
    }
  }
  return;
}

Assistant:

void push_back(T &&item)
    {
        if (max_items_ > 0)
        {
            v_[tail_] = std::move(item);
            tail_ = (tail_ + 1) % max_items_;

            if (tail_ == head_) // overrun last item if full
            {
                head_ = (head_ + 1) % max_items_;
                ++overrun_counter_;
            }
        }
    }